

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  string *in_RDX;
  FILE *in_RSI;
  ulong uVar4;
  char *buf;
  int size;
  FILE *in_stack_ffffffffffffff88;
  ValueSerializer *in_stack_ffffffffffffff90;
  allocator local_31;
  char *local_30;
  int local_24;
  string *local_20;
  FILE *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar2 = operator()(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(int *)0xf36997);
  if (bVar2) {
    uVar4 = (ulong)local_24;
    if ((long)uVar4 < 0) {
      uVar4 = 0xffffffffffffffff;
    }
    local_30 = (char *)operator_new__(uVar4);
    sVar3 = fread(local_30,(long)local_24,1,local_18);
    pcVar1 = local_30;
    if (sVar3 == 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_20,pcVar1,(long)local_24,&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
      local_1 = true;
    }
    else {
      if (local_30 != (char *)0x0) {
        operator_delete__(local_30);
      }
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool operator()(FILE* fp, string* value) {
    int size;
    if (!(*this)(fp, &size)) return false;
    char* buf = new char[size];
    if (fread(buf, size, 1, fp) != 1) {
      delete[] buf;
      return false;
    }
    new (value) string(buf, size);
    delete[] buf;
    return true;
  }